

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puppet.hpp
# Opt level: O2

void __thiscall henson::Puppet::~Puppet(Puppet *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  
  if ((this->super_Coroutine<henson::Puppet>).super_BaseCoroutine.running_ == true) {
    (this->super_Coroutine<henson::Puppet>).super_BaseCoroutine.stop_ = 1;
    Coroutine<henson::Puppet>::proceed(&this->super_Coroutine<henson::Puppet>);
  }
  ppcVar1 = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar2 = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppcVar2 != ppcVar1; ppcVar2 = ppcVar2 + 1) {
    if (*ppcVar2 != (char *)0x0) {
      operator_delete__(*ppcVar2);
    }
  }
  dlclose(this->lib_);
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            (&(this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>);
  std::__cxx11::string::~string((string *)&this->filename_);
  Coroutine<henson::Puppet>::~Coroutine(&this->super_Coroutine<henson::Puppet>);
  return;
}

Assistant:

~Puppet()
                        {
                            if(running_)
                            {
                                signal_stop();
                                proceed();
                            }

                            for (char* a : argv_)
                                delete[] a;

                            dlclose(lib_);
                        }